

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileExecutableTargetGenerator::cmMakefileExecutableTargetGenerator
          (cmMakefileExecutableTargetGenerator *this,cmGeneratorTarget *target)

{
  string *config;
  cmOSXBundleGenerator *this_00;
  string local_100;
  Names local_e0;
  
  cmMakefileTargetGenerator::cmMakefileTargetGenerator
            (&this->super_cmMakefileTargetGenerator,target);
  (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
  _vptr_cmCommonTargetGenerator = (_func_int **)&PTR__cmMakefileExecutableTargetGenerator_005e8a68;
  (this->DeviceLinkObject)._M_dataplus._M_p = (pointer)&(this->DeviceLinkObject).field_2;
  (this->DeviceLinkObject)._M_string_length = 0;
  (this->DeviceLinkObject).field_2._M_local_buf[0] = '\0';
  (this->super_cmMakefileTargetGenerator).CustomCommandDriver = OnDepends;
  config = &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName;
  cmGeneratorTarget::GetExecutableNames
            (&local_e0,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  cmGeneratorTarget::Names::operator=
            (&(this->super_cmMakefileTargetGenerator).TargetNames,&local_e0);
  cmGeneratorTarget::Names::~Names(&local_e0);
  this_00 = (cmOSXBundleGenerator *)operator_new(0x40);
  std::__cxx11::string::string((string *)&local_100,(string *)config);
  cmOSXBundleGenerator::cmOSXBundleGenerator(this_00,target,&local_100);
  (this->super_cmMakefileTargetGenerator).OSXBundleGenerator = this_00;
  std::__cxx11::string::~string((string *)&local_100);
  ((this->super_cmMakefileTargetGenerator).OSXBundleGenerator)->MacContentFolders =
       &(this->super_cmMakefileTargetGenerator).MacContentFolders;
  return;
}

Assistant:

cmMakefileExecutableTargetGenerator::cmMakefileExecutableTargetGenerator(
  cmGeneratorTarget* target)
  : cmMakefileTargetGenerator(target)
{
  this->CustomCommandDriver = OnDepends;
  this->TargetNames =
    this->GeneratorTarget->GetExecutableNames(this->ConfigName);

  this->OSXBundleGenerator =
    new cmOSXBundleGenerator(target, this->ConfigName);
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}